

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

lest * __thiscall lest::make_string<void>(lest *this,void *ptr)

{
  void *pvVar1;
  ostream *poVar2;
  string local_1c8 [34];
  char local_1a6;
  char local_1a5;
  int local_1a4;
  int local_1a0;
  ostringstream local_190 [8];
  ostringstream os;
  void *ptr_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pvVar1 = (void *)std::ostream::operator<<(local_190,std::internal);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,std::hex);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar1,std::showbase);
  local_1a4 = (int)std::setw(0x12);
  local_1a0 = local_1a4;
  poVar2 = std::operator<<(poVar2,(_Setw)local_1a4);
  local_1a6 = (char)std::setfill<char>('0');
  local_1a5 = local_1a6;
  poVar2 = std::operator<<(poVar2,local_1a6);
  std::ostream::operator<<(poVar2,(long)ptr);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

inline std::string make_string( T const * ptr )
{
    // Note showbase affects the behavior of /integer/ output;
    std::ostringstream os;
    os << std::internal << std::hex << std::showbase << std::setw( 2 + 2 * sizeof(T*) ) << std::setfill('0') << reinterpret_cast<std::ptrdiff_t>( ptr );
    return os.str();
}